

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_pwd.c
# Opt level: O3

err_t cmdPwdGen(cmd_pwd_t *pwd,char *cmdline)

{
  octet *poVar1;
  bool_t bVar2;
  err_t eVar3;
  u32 uVar4;
  int iVar5;
  size_t sVar6;
  octet *poVar7;
  octet *poVar8;
  char *pcVar9;
  char **ppcVar10;
  octet *pwd_00;
  octet *poVar11;
  int argc;
  char **argv;
  octet *local_88;
  octet *local_80;
  octet *local_78;
  char **local_70;
  octet *local_68;
  octet *local_60;
  octet *local_58;
  octet *local_50;
  octet *local_48;
  size_t local_40;
  long local_38;
  
  bVar2 = strStartsWith(cmdline,"pass:");
  if (bVar2 != 0) {
    pcVar9 = "pass:";
LAB_00104f88:
    strLen(pcVar9);
    return 0x77;
  }
  bVar2 = strStartsWith(cmdline,"env:");
  if (bVar2 != 0) {
    pcVar9 = "env:";
    goto LAB_00104f88;
  }
  bVar2 = strStartsWith(cmdline,"share:");
  if (bVar2 == 0) {
    return 0x25b;
  }
  sVar6 = strLen("share:");
  argv = (char **)0x0;
  local_68 = (octet *)0x0;
  eVar3 = cmdArgCreate(&argc,&argv,cmdline + sVar6);
  if (eVar3 != 0) {
    return eVar3;
  }
  local_78 = (octet *)0x0;
  if (argc != 0) {
    poVar7 = (octet *)0x0;
    local_80 = (octet *)0x0;
    ppcVar10 = (char **)0x0;
    do {
      bVar2 = strStartsWith(argv[(long)ppcVar10],"-");
      if (bVar2 == 0) break;
      bVar2 = strStartsWith(argv[(long)ppcVar10],"-t");
      pcVar9 = argv[(long)ppcVar10];
      if (bVar2 == 0) {
        local_88 = poVar7;
        bVar2 = strStartsWith(pcVar9,"-l");
        pcVar9 = argv[(long)ppcVar10];
        local_70 = ppcVar10;
        if (bVar2 == 0) {
          bVar2 = strStartsWith(pcVar9,"-crc");
          if (bVar2 == 0) {
            iVar5 = strCmp(argv[(long)local_70],"-pass");
            ppcVar10 = local_70;
            poVar7 = local_88;
            if (iVar5 != 0) {
LAB_0010533d:
              eVar3 = 0x25b;
              pwd_00 = local_68;
              goto LAB_00105326;
            }
            if (local_68 == (octet *)0x0) {
              argc = argc + -1;
              eVar3 = cmdPwdRead((cmd_pwd_t *)&local_68,argv[(long)local_70 + 1]);
              if (eVar3 == 0) {
                ppcVar10 = (char **)((long)ppcVar10 + 2);
                argc = argc + -1;
                goto LAB_001051a2;
              }
              goto LAB_0010532e;
            }
          }
          else if ((int)local_78 == 0) {
            if (local_88 == (octet *)0x10) goto LAB_0010533d;
            ppcVar10 = (char **)((long)local_70 + 1);
            argc = argc + -1;
            local_78 = (octet *)0x1;
            poVar7 = local_88;
            goto LAB_001051a2;
          }
        }
        else {
          sVar6 = strLen("-l");
          if (local_88 == (octet *)0x0) {
            pcVar9 = pcVar9 + sVar6;
            bVar2 = decIsValid(pcVar9);
            eVar3 = 0x25b;
            pwd_00 = local_68;
            if (((((bVar2 != 0) && (sVar6 = decCLZ(pcVar9), pwd_00 = local_68, sVar6 == 0)) &&
                 (sVar6 = strLen(pcVar9), pwd_00 = local_68, sVar6 == 3)) &&
                ((uVar4 = decToU32(pcVar9), pwd_00 = local_68, 0xffffff7e < uVar4 - 0x101 &&
                 ((uVar4 & 0x3f) == 0)))) && (uVar4 != 0x80 || (int)local_78 == 0)) {
              poVar7 = (octet *)(ulong)(uVar4 >> 3);
              ppcVar10 = local_70;
              goto LAB_0010518e;
            }
            goto LAB_00105326;
          }
        }
LAB_00105318:
        eVar3 = 0x25c;
        pwd_00 = local_68;
        goto LAB_00105326;
      }
      sVar6 = strLen("-t");
      if (local_80 != (octet *)0x0) goto LAB_00105318;
      pcVar9 = pcVar9 + sVar6;
      bVar2 = decIsValid(pcVar9);
      eVar3 = 0x25b;
      pwd_00 = local_68;
      if (((bVar2 == 0) || (sVar6 = decCLZ(pcVar9), pwd_00 = local_68, sVar6 != 0)) ||
         ((sVar6 = strLen(pcVar9), pwd_00 = local_68, 2 < sVar6 ||
          (uVar4 = decToU32(pcVar9), pwd_00 = local_68, uVar4 - 0x11 < 0xfffffff1))))
      goto LAB_00105326;
      local_80 = (octet *)(ulong)uVar4;
LAB_0010518e:
      ppcVar10 = (char **)((long)ppcVar10 + 1);
      argc = argc + -1;
LAB_001051a2:
    } while (argc != 0);
    pwd_00 = local_68;
    if (local_68 != (octet *)0x0) {
      poVar8 = (octet *)0x2;
      if (local_80 != (octet *)0x0) {
        poVar8 = local_80;
      }
      eVar3 = 0x25b;
      if ((poVar8 <= (octet *)(long)argc) &&
         (eVar3 = cmdFileValNotExist(argc,argv + (long)ppcVar10), eVar3 == 0)) {
        ppcVar10 = argv + (long)ppcVar10;
        local_80 = (octet *)(long)argc;
        *pwd = (cmd_pwd_t)0x0;
        poVar11 = (octet *)0x20;
        if (poVar7 != (octet *)0x0) {
          poVar11 = poVar7;
        }
        poVar7 = poVar11 + 1;
        local_88 = poVar8;
        eVar3 = bpkiShareWrap((octet *)0x0,&local_40,(octet *)0x0,(size_t)poVar7,(octet *)0x0,0,
                              (octet *)0x0,10000);
        if ((eVar3 == 0) && (eVar3 = cmdRngStart(1), eVar3 == 0)) {
          local_70 = ppcVar10;
          sVar6 = beltMAC_keep();
          local_38 = (long)poVar7 * (long)local_80;
          local_48 = poVar7;
          sVar6 = utilMax(2,sVar6,local_38 + local_40 + 8);
          poVar7 = (octet *)blobCreate((size_t)(poVar11 + sVar6));
          if (poVar7 == (octet *)0x0) {
            eVar3 = 0x6e;
          }
          else {
            local_60 = poVar7 + (long)poVar11;
            if ((int)local_78 == 0) {
              rngStepR(poVar7,(size_t)poVar11,(void *)0x0);
            }
            else {
              poVar8 = poVar11 + -8;
              rngStepR(poVar7,(size_t)poVar8,(void *)0x0);
              poVar1 = local_60;
              beltMACStart(local_60,poVar7,(size_t)poVar8);
              beltMACStepA(poVar7,(size_t)poVar8,poVar1);
              beltMACStepG(poVar1 + -8,poVar1);
            }
            local_58 = poVar11;
            local_50 = poVar7;
            eVar3 = belsShare2(local_60,(size_t)local_80,(size_t)local_88,(size_t)poVar11,poVar7,
                               rngStepR,(void *)0x0);
            if (eVar3 == 0) {
              rngRekey();
              if ((int)local_80 != 0) {
                local_88 = local_60 + local_38;
                poVar8 = local_60 + local_38 + 8;
                poVar11 = (octet *)0x0;
                poVar7 = local_60;
                local_78 = poVar8;
                do {
                  poVar1 = local_48;
                  rngStepR(local_88,8,(void *)0x0);
                  sVar6 = strLen((char *)pwd_00);
                  eVar3 = bpkiShareWrap(poVar8,(size_t *)0x0,poVar7,(size_t)poVar1,pwd_00,sVar6,
                                        local_88,10000);
                  if ((eVar3 != 0) ||
                     (eVar3 = cmdFileWrite(local_70[(long)poVar11],poVar8,local_40), eVar3 != 0))
                  goto LAB_00105442;
                  poVar7 = poVar7 + (long)local_48;
                  poVar11 = poVar11 + 1;
                } while (local_80 != poVar11);
              }
              pcVar9 = (char *)blobCreate((long)local_58 * 2 + 1);
              *pwd = pcVar9;
              if (pcVar9 == (char *)0x0) {
                eVar3 = 0x6e;
              }
              else {
                hexFrom(pcVar9,local_50,(size_t)local_58);
                eVar3 = 0;
              }
            }
LAB_00105442:
            blobClose(local_50);
          }
        }
      }
      goto LAB_00105326;
    }
  }
  pwd_00 = (octet *)0x0;
  eVar3 = 0x25b;
LAB_00105326:
  blobClose(pwd_00);
LAB_0010532e:
  cmdArgClose(argv);
  return eVar3;
}

Assistant:

err_t cmdPwdGen(cmd_pwd_t* pwd, const char* cmdline)
{
	if (strStartsWith(cmdline, "pass:"))
		return cmdPwdGenPass(pwd, cmdline + strLen("pass:"));
	else if (strStartsWith(cmdline, "env:"))
		return cmdPwdGenEnv(pwd, cmdline + strLen("env:"));
	else if (strStartsWith(cmdline, "share:"))
		return cmdPwdGenShare(pwd, cmdline + strLen("share:"));
	return ERR_CMD_PARAMS;
}